

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O1

void sx_signal_init(sx_signal *sig)

{
  code *pcVar1;
  int iVar2;
  
  sig->data[0x58] = '\0';
  sig->data[0x59] = '\0';
  sig->data[0x5a] = '\0';
  sig->data[0x5b] = '\0';
  iVar2 = pthread_mutex_init((pthread_mutex_t *)sig,(pthread_mutexattr_t *)0x0);
  if (iVar2 != 0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/threads.c",
                      0x161,"pthread_mutex_init failed");
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  iVar2 = pthread_cond_init((pthread_cond_t *)(sig->data + 0x28),(pthread_condattr_t *)0x0);
  if (iVar2 != 0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/threads.c",
                      0x164,"pthread_cond_init failed");
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  return;
}

Assistant:

void sx_signal_init(sx_signal* sig)
{
    sx__signal* _sig = (sx__signal*)sig->data;
    _sig->value = 0;
    int r = pthread_mutex_init(&_sig->mutex, NULL);
    sx_assertf(r == 0, "pthread_mutex_init failed");

    r = pthread_cond_init(&_sig->cond, NULL);
    sx_assertf(r == 0, "pthread_cond_init failed");

    sx_unused(r);
}